

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::SetPermissions(string *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  char *__file;
  mode_t currentMask;
  bool honor_umask_local;
  mode_t mode_local;
  string *file_local;
  
  bVar1 = PathExists(file);
  if (bVar1) {
    currentMask = mode;
    if (honor_umask) {
      __mask = umask(0);
      umask(__mask);
      currentMask = (__mask ^ 0xffffffff) & mode;
    }
    __file = (char *)std::__cxx11::string::c_str();
    iVar2 = chmod(__file,currentMask);
    if (iVar2 < 0) {
      file_local._7_1_ = false;
    }
    else {
      file_local._7_1_ = true;
    }
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool SystemTools::SetPermissions(const std::string& file, mode_t mode,
                                 bool honor_umask)
{
  if (!SystemTools::PathExists(file)) {
    return false;
  }
  if (honor_umask) {
    mode_t currentMask = umask(0);
    umask(currentMask);
    mode &= ~currentMask;
  }
#ifdef _WIN32
  if (_wchmod(Encoding::ToWindowsExtendedPath(file).c_str(), mode) < 0)
#else
  if (chmod(file.c_str(), mode) < 0)
#endif
  {
    return false;
  }

  return true;
}